

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

path_t * __thiscall CField::get_solution_abi_cxx11_(path_t *__return_storage_ptr__,CField *this)

{
  passed_t *this_00;
  pos_t *b;
  SState this_01;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  int iVar4;
  int iVar5;
  value_type local_68;
  SState local_48;
  SState s;
  allocator<char> local_31;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  local_48.direction = EP_SOUTH;
  local_48.inverted = false;
  local_48.drunken = false;
  this_00 = &this->passed;
  b = &this->bender;
  s = (SState)__return_storage_ptr__;
  while( true ) {
    local_68._M_dataplus._M_p = *(pointer *)b;
    local_68._M_string_length = CONCAT26(local_48._6_2_,CONCAT24(local_48._4_2_,local_48.direction))
    ;
    iVar3 = std::
            _Rb_tree<std::pair<std::pair<int,_int>,_CField::SState>,_std::pair<std::pair<int,_int>,_CField::SState>,_std::_Identity<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
            ::find(&this_00->_M_t,(key_type *)&local_68);
    this_01 = s;
    if (&(this->passed)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)iVar3._M_node)
    break;
    iVar4 = (this->_exit).first;
    if ((iVar4 == (this->bender).first) &&
       (iVar2 = (this->_exit).second, iVar5 = iVar2, iVar2 == (this->bender).second))
    goto LAB_00106a38;
    local_68._M_dataplus._M_p = *(pointer *)b;
    local_68._M_string_length = CONCAT26(local_48._6_2_,CONCAT24(local_48._4_2_,local_48.direction))
    ;
    std::
    _Rb_tree<std::pair<std::pair<int,int>,CField::SState>,std::pair<std::pair<int,int>,CField::SState>,std::_Identity<std::pair<std::pair<int,int>,CField::SState>>,std::less<std::pair<std::pair<int,int>,CField::SState>>,std::allocator<std::pair<std::pair<int,int>,CField::SState>>>
    ::_M_insert_unique<std::pair<std::pair<int,int>,CField::SState>>
              ((_Rb_tree<std::pair<std::pair<int,int>,CField::SState>,std::pair<std::pair<int,int>,CField::SState>,std::_Identity<std::pair<std::pair<int,int>,CField::SState>>,std::less<std::pair<std::pair<int,int>,CField::SState>>,std::allocator<std::pair<std::pair<int,int>,CField::SState>>>
                *)this_00,(pair<std::pair<int,_int>,_CField::SState> *)&local_68);
    bVar1 = step(this,b,&local_48,(path_t *)s);
    if (bVar1) {
      std::
      _Rb_tree<std::pair<std::pair<int,_int>,_CField::SState>,_std::pair<std::pair<int,_int>,_CField::SState>,_std::_Identity<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
      ::clear(&this_00->_M_t);
    }
  }
  iVar2 = (this->bender).second;
  iVar4 = (this->_exit).first;
  iVar5 = (this->_exit).second;
LAB_00106a38:
  if ((iVar4 != b->first) || (iVar5 != iVar2)) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)s);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"LOOP",&local_31);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return (path_t *)this_01;
}

Assistant:

path_t get_solution()
        {
            //dump_field();
            path_t result;
            SState s(EP_SOUTH, false, false);
            while (passed.end() == passed.find(cell_state_t(bender, s))
                && _exit != bender)
            {
                passed.insert(cell_state_t(bender, s));
                bool should_clear = step(bender, s, result);
                if (should_clear)
                {
                    passed.clear();
                }
            }
            if (_exit != bender)
            {
                result.clear();
                result.push_back("LOOP");
            }
            
            return result;
        }